

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O2

void __thiscall icu_63::CalendarAstronomer::setJulianDay(CalendarAstronomer *this,double jdn)

{
  this->fTime = jdn * 86400000.0 + -210866760000000.0;
  clearCache(this);
  this->julianDay = jdn;
  return;
}

Assistant:

void CalendarAstronomer::setJulianDay(double jdn) {
    fTime = (double)(jdn * DAY_MS) + JULIAN_EPOCH_MS;
    clearCache();
    julianDay = jdn;
}